

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl
          (XMLSchemaDescriptionImpl *this,XMLCh *targetNamespace,MemoryManager *memMgr)

{
  short *psVar1;
  int iVar2;
  XMLSize_t index;
  undefined4 extraout_var;
  RefArrayVectorOf<char16_t> *pRVar3;
  undefined4 extraout_var_00;
  long lVar4;
  size_t __n;
  
  XMLSchemaDescription::XMLSchemaDescription(&this->super_XMLSchemaDescription,memMgr);
  (this->super_XMLSchemaDescription).super_XMLGrammarDescription.super_XSerializable.
  _vptr_XSerializable = (_func_int **)&PTR__XMLSchemaDescriptionImpl_0041c3e0;
  this->fContextType = CONTEXT_UNKNOWN;
  this->fNamespace = (XMLCh *)0x0;
  this->fLocationHints = (RefArrayVectorOf<char16_t> *)0x0;
  this->fTriggeringComponent = (QName *)0x0;
  this->fEnclosingElementName = (QName *)0x0;
  this->fAttributes = (XMLAttDef *)0x0;
  if (targetNamespace != (XMLCh *)0x0) {
    __n = 0;
    do {
      psVar1 = (short *)((long)targetNamespace + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,__n);
    memcpy((XMLCh *)CONCAT44(extraout_var,iVar2),targetNamespace,__n);
    this->fNamespace = (XMLCh *)CONCAT44(extraout_var,iVar2);
  }
  pRVar3 = (RefArrayVectorOf<char16_t> *)XMemory::operator_new(0x30,memMgr);
  (pRVar3->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__BaseRefVectorOf_0040c1a0;
  (pRVar3->super_BaseRefVectorOf<char16_t>).fAdoptedElems = true;
  (pRVar3->super_BaseRefVectorOf<char16_t>).fCurCount = 0;
  (pRVar3->super_BaseRefVectorOf<char16_t>).fMaxCount = 4;
  (pRVar3->super_BaseRefVectorOf<char16_t>).fElemList = (char16_t **)0x0;
  (pRVar3->super_BaseRefVectorOf<char16_t>).fMemoryManager = memMgr;
  iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,0x20);
  (pRVar3->super_BaseRefVectorOf<char16_t>).fElemList = (char16_t **)CONCAT44(extraout_var_00,iVar2)
  ;
  lVar4 = 0;
  do {
    (pRVar3->super_BaseRefVectorOf<char16_t>).fElemList[lVar4] = (char16_t *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  (pRVar3->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__RefArrayVectorOf_0040c128;
  this->fLocationHints = pRVar3;
  return;
}

Assistant:

XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl(const XMLCh* const   targetNamespace
                                                 , MemoryManager* const memMgr)
:XMLSchemaDescription(memMgr)
,fContextType(CONTEXT_UNKNOWN)
,fNamespace(0)
,fLocationHints(0)
,fTriggeringComponent(0)
,fEnclosingElementName(0)
,fAttributes(0) 
{
    if (targetNamespace)
        fNamespace = XMLString::replicate(targetNamespace, memMgr);


    fLocationHints =  new (memMgr) RefArrayVectorOf<XMLCh>(4, true, memMgr);

    /***
        fAttributes
    ***/
}